

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

Chain __thiscall S2Loop::Shape::chain(Shape *this,int i)

{
  uint uVar1;
  ulong uVar2;
  S2LogMessage SStack_18;
  
  if (i == 0) {
    uVar1 = this->loop_->num_vertices_;
    uVar2 = 0;
    if (uVar1 != 1) {
      uVar2 = (ulong)uVar1;
    }
    return (Chain)(uVar2 << 0x20);
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
             ,0x5e3,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (i) == (0) ",0x19);
  abort();
}

Assistant:

S2Shape::Chain S2Loop::Shape::chain(int i) const {
  S2_DCHECK_EQ(i, 0);
  return Chain(0, Shape::num_edges());  // Avoid virtual call.
}